

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

HaF64 __thiscall dgPolyhedra::EdgePenalty(dgPolyhedra *this,dgBigVector *pool,dgEdge *edge)

{
  dgBigVector *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  dgEdge *pdVar19;
  dgEdge *pdVar20;
  dgPolyhedra *this_00;
  int iVar21;
  double __x;
  undefined1 *puVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM6 [64];
  dgBigVector twinNormal;
  dgBigVector e2;
  dgBigVector n1;
  dgBigVector p;
  dgTemplateVector<double> local_88;
  dgTemplateVector<double> *local_68;
  double local_60;
  double local_58;
  dgBigVector dp;
  
  auVar61 = in_ZMM6._0_16_;
  this_00 = (dgPolyhedra *)&p;
  dgTemplateVector<double>::operator-
            (&pool[edge->m_next->m_incidentVertex].super_dgTemplateVector<double>,
             &pool[edge->m_incidentVertex].super_dgTemplateVector<double>);
  dgBigVector::dgBigVector(&dp,(dgTemplateVector<double> *)this_00);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dp.super_dgTemplateVector<double>.m_x;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dp.super_dgTemplateVector<double>.m_z;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dp.super_dgTemplateVector<double>.m_y * dp.super_dgTemplateVector<double>.m_y;
  auVar23 = vfmadd231sd_fma(auVar35,auVar23,auVar23);
  auVar23 = vfmadd213sd_fma(auVar48,auVar48,auVar23);
  if (auVar23._0_8_ < 9.999999974752427e-07) {
    return (HaF64)&DAT_bff0000000000000;
  }
  iVar21 = edge->m_incidentFace;
  if ((iVar21 < 1) || (edge->m_twin->m_incidentFace < 1)) {
LAB_00da1093:
    iVar9 = edge->m_twin->m_incidentFace;
    iVar10 = edge->m_twin->m_incidentVertex;
    dgBigVector::dgBigVector
              (&p,(HaF64)pool[iVar10].super_dgTemplateVector<double>.m_x,
               (HaF64)pool[iVar10].super_dgTemplateVector<double>.m_y,
               (HaF64)pool[iVar10].super_dgTemplateVector<double>.m_z,0.0);
    pdVar19 = edge;
    do {
      pdVar20 = pdVar19->m_twin;
      iVar10 = pdVar20->m_incidentFace;
      if ((((iVar10 != iVar9) && (-1 < iVar10 && iVar10 != iVar21)) &&
          (pdVar20->m_next->m_incidentFace == iVar10)) &&
         (pdVar20->m_prev->m_incidentFace == iVar10)) {
        iVar10 = pdVar20->m_next->m_incidentVertex;
        iVar11 = pdVar20->m_prev->m_incidentVertex;
        iVar12 = pdVar20->m_incidentVertex;
        dgTemplateVector<double>::operator-
                  (&pool[iVar12].super_dgTemplateVector<double>,
                   &pool[iVar10].super_dgTemplateVector<double>);
        dgTemplateVector<double>::operator-
                  (&pool[iVar11].super_dgTemplateVector<double>,
                   &pool[iVar10].super_dgTemplateVector<double>);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = e2.super_dgTemplateVector<double>.m_x;
        auVar56._8_8_ = e2.super_dgTemplateVector<double>.m_z;
        auVar56._0_8_ = e2.super_dgTemplateVector<double>.m_z;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_88.m_x;
        auVar62._8_8_ = local_88.m_z;
        auVar62._0_8_ = local_88.m_z;
        auVar13._8_8_ = e2.super_dgTemplateVector<double>.m_z;
        auVar13._0_8_ = e2.super_dgTemplateVector<double>.m_y;
        auVar16._8_8_ = local_88.m_z;
        auVar16._0_8_ = local_88.m_y;
        auVar23 = vunpcklpd_avx(auVar56,auVar39);
        auVar35 = vunpcklpd_avx(auVar62,auVar26);
        auVar57._0_8_ = local_88.m_y * auVar23._0_8_;
        auVar57._8_8_ = local_88.m_z * auVar23._8_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_88.m_x * e2.super_dgTemplateVector<double>.m_y;
        auVar23 = vfmsub231sd_fma(auVar27,auVar39,auVar16);
        n1.super_dgTemplateVector<double>._0_16_ = vfmsub213pd_fma(auVar35,auVar13,auVar57);
        n1.super_dgTemplateVector<double>.m_z = auVar23._0_8_;
        n1.super_dgTemplateVector<double>.m_w = e2.super_dgTemplateVector<double>.m_w;
        dgBigVector::dgBigVector(&twinNormal,&n1.super_dgTemplateVector<double>);
        auVar15._8_8_ = p.super_dgTemplateVector<double>.m_z;
        auVar15._0_8_ = p.super_dgTemplateVector<double>.m_y;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = p.super_dgTemplateVector<double>.m_x;
        auVar63._8_8_ = p.super_dgTemplateVector<double>.m_z;
        auVar63._0_8_ = p.super_dgTemplateVector<double>.m_z;
        e2.super_dgTemplateVector<double>.m_w = pool[iVar12].super_dgTemplateVector<double>.m_w;
        auVar2._0_8_ = pool[iVar12].super_dgTemplateVector<double>.m_y;
        auVar2._8_8_ = pool[iVar12].super_dgTemplateVector<double>.m_z;
        auVar48 = vunpcklpd_avx(auVar63,auVar40);
        auVar35 = vsubpd_avx(auVar2,auVar15);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = pool[iVar11].super_dgTemplateVector<double>.m_z;
        auVar23 = vmovhpd_avx(auVar58,pool[iVar11].super_dgTemplateVector<double>.m_x);
        auVar48 = vsubpd_avx(auVar23,auVar48);
        auVar28._8_8_ = 0;
        auVar28._0_8_ =
             pool[iVar12].super_dgTemplateVector<double>.m_x - p.super_dgTemplateVector<double>.m_x;
        auVar23 = vshufpd_avx(auVar35,auVar28,1);
        auVar50._8_8_ = 0;
        auVar50._0_8_ =
             pool[iVar11].super_dgTemplateVector<double>.m_y - p.super_dgTemplateVector<double>.m_y;
        auVar61 = vunpcklpd_avx(auVar50,auVar48);
        auVar59._0_8_ = auVar61._0_8_ * auVar23._0_8_;
        auVar59._8_8_ = auVar61._8_8_ * auVar23._8_8_;
        auVar61 = vfmsub231pd_fma(auVar59,auVar35,auVar48);
        auVar23 = vshufpd_avx(auVar48,auVar48,1);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar23._0_8_ * auVar35._0_8_;
        auVar23 = vfmsub231sd_fma(auVar41,auVar28,auVar50);
        e2.super_dgTemplateVector<double>.m_x = auVar61._0_8_;
        e2.super_dgTemplateVector<double>.m_y = auVar61._8_8_;
        e2.super_dgTemplateVector<double>.m_z = auVar23._0_8_;
        dgBigVector::dgBigVector
                  ((dgBigVector *)&n1.super_dgTemplateVector<double>,
                   &e2.super_dgTemplateVector<double>);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = twinNormal.super_dgTemplateVector<double>.m_x;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = n1.super_dgTemplateVector<double>.m_x;
        auVar42._8_8_ = 0;
        auVar42._0_8_ =
             twinNormal.super_dgTemplateVector<double>.m_y * n1.super_dgTemplateVector<double>.m_y;
        auVar23 = vfmadd231sd_fma(auVar42,auVar29,auVar7);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = twinNormal.super_dgTemplateVector<double>.m_z;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = n1.super_dgTemplateVector<double>.m_z;
        auVar23 = vfmadd132sd_fma(auVar30,auVar23,auVar8);
        if (auVar23._0_8_ < 0.0) goto LAB_00da1042;
        pdVar20 = pdVar19->m_twin;
      }
      pdVar19 = pdVar20->m_next;
    } while (pdVar19 != edge);
    iVar21 = edge->m_twin->m_incidentVertex;
    pdVar19 = edge->m_twin->m_next;
    pdVar1 = pool + iVar21;
    auVar18._0_8_ = (pdVar1->super_dgTemplateVector<double>).m_x;
    auVar18._8_8_ = (pdVar1->super_dgTemplateVector<double>).m_y;
    auVar17._0_8_ = (pdVar1->super_dgTemplateVector<double>).m_x;
    auVar17._8_8_ = (pdVar1->super_dgTemplateVector<double>).m_y;
    dVar47 = pool[iVar21].super_dgTemplateVector<double>.m_z;
    local_58 = pool[iVar21].super_dgTemplateVector<double>.m_w;
    auVar34 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    while( true ) {
      pdVar19 = pdVar19->m_twin->m_next;
      __x = auVar34._0_8_;
      if (pdVar19 == edge) break;
      if (0 < pdVar19->m_incidentFace) {
        iVar21 = pdVar19->m_next->m_incidentVertex;
        iVar9 = pdVar19->m_prev->m_incidentVertex;
        auVar3._0_8_ = pool[iVar21].super_dgTemplateVector<double>.m_x;
        auVar3._8_8_ = pool[iVar21].super_dgTemplateVector<double>.m_y;
        local_68 = &pool[iVar21].super_dgTemplateVector<double>;
        n1.super_dgTemplateVector<double>.m_z =
             pool[iVar21].super_dgTemplateVector<double>.m_z - dVar47;
        n1.super_dgTemplateVector<double>._0_16_ = vsubpd_avx(auVar3,auVar17);
        n1.super_dgTemplateVector<double>.m_w = pool[iVar21].super_dgTemplateVector<double>.m_w;
        local_60 = __x;
        dgBigVector::dgBigVector(&twinNormal,&n1.super_dgTemplateVector<double>);
        dgTemplateVector<double>::operator-(&pool[iVar9].super_dgTemplateVector<double>,local_68);
        dgBigVector::dgBigVector(&n1,&e2.super_dgTemplateVector<double>);
        auVar4._0_8_ = pool[iVar9].super_dgTemplateVector<double>.m_x;
        auVar4._8_8_ = pool[iVar9].super_dgTemplateVector<double>.m_y;
        auVar23 = vsubpd_avx(auVar18,auVar4);
        local_88.m_z = dVar47 - pool[iVar9].super_dgTemplateVector<double>.m_z;
        local_88.m_x = auVar23._0_8_;
        local_88.m_y = auVar23._8_8_;
        local_88.m_w = local_58;
        dgBigVector::dgBigVector(&e2,&local_88);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = twinNormal.super_dgTemplateVector<double>.m_x;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = e2.super_dgTemplateVector<double>.m_x;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = e2.super_dgTemplateVector<double>.m_z;
        auVar43._8_8_ = 0;
        auVar43._0_8_ =
             twinNormal.super_dgTemplateVector<double>.m_y *
             twinNormal.super_dgTemplateVector<double>.m_y;
        auVar23 = vfmadd231sd_fma(auVar43,auVar31,auVar31);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = twinNormal.super_dgTemplateVector<double>.m_z;
        auVar51._8_8_ = 0;
        auVar51._0_8_ =
             e2.super_dgTemplateVector<double>.m_y * e2.super_dgTemplateVector<double>.m_y;
        auVar35 = vfmadd231sd_fma(auVar51,auVar60,auVar60);
        auVar48 = vfmadd213sd_fma(auVar54,auVar54,auVar35);
        auVar35 = vfmadd213sd_fma(auVar32,auVar32,auVar23);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = n1.super_dgTemplateVector<double>.m_x;
        auVar49._8_8_ = 0;
        auVar49._0_8_ =
             n1.super_dgTemplateVector<double>.m_y * n1.super_dgTemplateVector<double>.m_y;
        auVar23 = vfmadd231sd_fma(auVar49,auVar44,auVar44);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = n1.super_dgTemplateVector<double>.m_z;
        auVar61 = vfmadd213sd_fma(auVar45,auVar45,auVar23);
        auVar23 = vmaxsd_avx(auVar61,auVar35);
        auVar35 = vminsd_avx(auVar61,auVar35);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_60;
        auVar23 = vmaxsd_avx(auVar48,auVar23);
        auVar35 = vminsd_avx(auVar48,auVar35);
        auVar46._0_8_ = auVar35._0_8_ / auVar23._0_8_;
        auVar46._8_8_ = auVar35._8_8_;
        auVar23 = vminsd_avx(auVar46,auVar33);
        auVar34 = ZEXT1664(auVar23);
      }
    }
    if (__x < 0.0) {
      puVar22 = (undefined1 *)sqrt(__x);
    }
    else {
      auVar23 = vsqrtsd_avx(auVar34._0_16_,auVar34._0_16_);
      puVar22 = auVar23._0_8_;
    }
  }
  else {
    FaceNormal(&p,this_00,edge,(HaF64 *)pool,0x20);
    FaceNormal(&twinNormal,this_00,edge->m_twin,(HaF64 *)pool,0x20);
    auVar14._8_8_ = p.super_dgTemplateVector<double>.m_y;
    auVar14._0_8_ = p.super_dgTemplateVector<double>.m_x;
    auVar36._0_8_ = p.super_dgTemplateVector<double>.m_x * p.super_dgTemplateVector<double>.m_x;
    auVar36._8_8_ = p.super_dgTemplateVector<double>.m_y * p.super_dgTemplateVector<double>.m_y;
    auVar23 = vshufpd_avx(auVar36,auVar36,1);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = p.super_dgTemplateVector<double>.m_z;
    auVar23 = vfmadd231sd_fma(auVar23,auVar14,auVar14);
    auVar23 = vfmadd231sd_fma(auVar23,auVar37,auVar37);
    if (1.0000000195414814e-24 <= auVar23._0_8_) {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = twinNormal.super_dgTemplateVector<double>.m_x;
      auVar55._8_8_ = 0;
      auVar55._0_8_ =
           twinNormal.super_dgTemplateVector<double>.m_y *
           twinNormal.super_dgTemplateVector<double>.m_y;
      auVar35 = vfmadd231sd_fma(auVar55,auVar52,auVar52);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = twinNormal.super_dgTemplateVector<double>.m_z;
      auVar35 = vfmadd213sd_fma(auVar53,auVar53,auVar35);
      if (1.0000000195414814e-24 <= auVar35._0_8_) {
        auVar23 = vsqrtsd_avx(auVar23,auVar23);
        dVar47 = 1.0 / auVar23._0_8_;
        e2.super_dgTemplateVector<double>.m_z = dVar47 * p.super_dgTemplateVector<double>.m_z;
        e2.super_dgTemplateVector<double>.m_x = dVar47 * p.super_dgTemplateVector<double>.m_x;
        e2.super_dgTemplateVector<double>.m_y = dVar47 * p.super_dgTemplateVector<double>.m_y;
        e2.super_dgTemplateVector<double>.m_w = p.super_dgTemplateVector<double>.m_w;
        dgBigVector::dgBigVector(&n1,&e2.super_dgTemplateVector<double>);
        p.super_dgTemplateVector<double>.m_x = n1.super_dgTemplateVector<double>.m_x;
        p.super_dgTemplateVector<double>.m_y = n1.super_dgTemplateVector<double>.m_y;
        p.super_dgTemplateVector<double>.m_z = n1.super_dgTemplateVector<double>.m_z;
        p.super_dgTemplateVector<double>.m_w = n1.super_dgTemplateVector<double>.m_w;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auVar35._0_8_;
        auVar23 = vsqrtsd_avx(auVar61,auVar5);
        dVar47 = 1.0 / auVar23._0_8_;
        e2.super_dgTemplateVector<double>.m_z =
             dVar47 * twinNormal.super_dgTemplateVector<double>.m_z;
        e2.super_dgTemplateVector<double>.m_x =
             dVar47 * twinNormal.super_dgTemplateVector<double>.m_x;
        e2.super_dgTemplateVector<double>.m_y =
             dVar47 * twinNormal.super_dgTemplateVector<double>.m_y;
        e2.super_dgTemplateVector<double>.m_w = twinNormal.super_dgTemplateVector<double>.m_w;
        dgBigVector::dgBigVector(&n1,&e2.super_dgTemplateVector<double>);
        twinNormal.super_dgTemplateVector<double>.m_x = n1.super_dgTemplateVector<double>.m_x;
        twinNormal.super_dgTemplateVector<double>.m_y = n1.super_dgTemplateVector<double>.m_y;
        twinNormal.super_dgTemplateVector<double>.m_z = n1.super_dgTemplateVector<double>.m_z;
        twinNormal.super_dgTemplateVector<double>.m_w = n1.super_dgTemplateVector<double>.m_w;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = p.super_dgTemplateVector<double>.m_x;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = n1.super_dgTemplateVector<double>.m_x;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = p.super_dgTemplateVector<double>.m_y * n1.super_dgTemplateVector<double>.m_y
        ;
        auVar23 = vfmadd231sd_fma(auVar38,auVar24,auVar61);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = p.super_dgTemplateVector<double>.m_z;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = n1.super_dgTemplateVector<double>.m_z;
        auVar23 = vfmadd132sd_fma(auVar25,auVar23,auVar6);
        pdVar19 = edge;
        if (-0.8999999761581421 <= auVar23._0_8_) {
          do {
            if ((pdVar19->m_incidentFace < 1) ||
               (pdVar20 = pdVar19->m_twin, pdVar20->m_incidentFace < 1)) {
              pdVar19 = edge;
              do {
                if ((pdVar19->m_incidentFace < 1) || (pdVar19->m_twin->m_incidentFace < 1))
                goto LAB_00da1042;
                pdVar19 = pdVar19->m_twin->m_next;
              } while (pdVar19 != edge->m_twin);
              pdVar20 = pdVar19->m_twin;
            }
            pdVar19 = pdVar20->m_next;
          } while (pdVar20->m_next != edge);
          iVar21 = edge->m_incidentFace;
          goto LAB_00da1093;
        }
      }
    }
LAB_00da1042:
    puVar22 = &DAT_bff0000000000000;
  }
  return (HaF64)puVar22;
}

Assistant:

hacd::HaF64 dgPolyhedra::EdgePenalty (const dgBigVector* const pool, dgEdge* const edge) const
{
	hacd::HaI32 i0 = edge->m_incidentVertex;
	hacd::HaI32 i1 = edge->m_next->m_incidentVertex;

	const dgBigVector& p0 = pool[i0];
	const dgBigVector& p1 = pool[i1];
	dgBigVector dp (p1 - p0);

	hacd::HaF64 dot = dp % dp;
	if (dot < hacd::HaF64(1.0e-6f)) {
		return hacd::HaF64 (-1.0f);
	}

	if ((edge->m_incidentFace > 0) && (edge->m_twin->m_incidentFace > 0)) {
		dgBigVector edgeNormal (FaceNormal (edge, &pool[0].m_x, sizeof (dgBigVector)));
		dgBigVector twinNormal (FaceNormal (edge->m_twin, &pool[0].m_x, sizeof (dgBigVector)));

		hacd::HaF64 mag0 = edgeNormal % edgeNormal;
		hacd::HaF64 mag1 = twinNormal % twinNormal;
		if ((mag0 < hacd::HaF64 (1.0e-24f)) || (mag1 < hacd::HaF64 (1.0e-24f))) {
			return hacd::HaF64 (-1.0f);
		}

		edgeNormal = edgeNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag0));
		twinNormal = twinNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag1));

		dot = edgeNormal % twinNormal;
		if (dot < hacd::HaF64 (-0.9f)) {
			return hacd::HaF32 (-1.0f);
		}

		dgEdge* ptr = edge;
		do {
			if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
				dgEdge* const adj = edge->m_twin;
				ptr = edge;
				do {
					if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
						return hacd::HaF32 (-1.0);
					}
					ptr = ptr->m_twin->m_next;
				} while (ptr != adj);
			}
			ptr = ptr->m_twin->m_next;
		} while (ptr != edge);
	}

	hacd::HaI32 faceA = edge->m_incidentFace;
	hacd::HaI32 faceB = edge->m_twin->m_incidentFace;

	i0 = edge->m_twin->m_incidentVertex;
	dgBigVector p (pool[i0].m_x, pool[i0].m_y, pool[i0].m_z, hacd::HaF32 (0.0f));

	bool penalty = false;
	dgEdge* ptr = edge;
	do {
		dgEdge* const adj = ptr->m_twin;

		hacd::HaI32 face = adj->m_incidentFace;
		if ((face != faceB) && (face != faceA) && (face >= 0) && (adj->m_next->m_incidentFace == face) && (adj->m_prev->m_incidentFace == face)){

			hacd::HaI32 i0 = adj->m_next->m_incidentVertex;
			const dgBigVector& p0 = pool[i0];

			hacd::HaI32 i1 = adj->m_incidentVertex;
			const dgBigVector& p1 = pool[i1];

			hacd::HaI32 i2 = adj->m_prev->m_incidentVertex;
			const dgBigVector& p2 = pool[i2];

			dgBigVector n0 ((p1 - p0) * (p2 - p0));
			dgBigVector n1 ((p1 - p) * (p2 - p));

//			hacd::HaF64 mag0 = n0 % n0;
//			HACD_ASSERT (mag0 > hacd::HaF64(1.0e-16f));
//			mag0 = sqrt (mag0);

//			hacd::HaF64 mag1 = n1 % n1;
//			mag1 = sqrt (mag1);

			hacd::HaF64 dot = n0 % n1;
			if (dot < hacd::HaF64 (0.0f)) {
//			if (dot <= (mag0 * mag1 * hacd::HaF32 (0.707f)) || (mag0 > (hacd::HaF64(16.0f) * mag1))) {
				penalty = true;
				break;
			}
		}

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);

	hacd::HaF64 aspect = hacd::HaF32 (-1.0f);
	if (!penalty) {
		hacd::HaI32 i0 = edge->m_twin->m_incidentVertex;
		dgBigVector p0 (pool[i0]);

		aspect = hacd::HaF32 (1.0f);
		for (dgEdge* ptr = edge->m_twin->m_next->m_twin->m_next; ptr != edge; ptr = ptr->m_twin->m_next) {
			if (ptr->m_incidentFace > 0) {
				hacd::HaI32 i0 = ptr->m_next->m_incidentVertex;
				const dgBigVector& p1 = pool[i0];

				hacd::HaI32 i1 = ptr->m_prev->m_incidentVertex;
				const dgBigVector& p2 = pool[i1];

				dgBigVector e0 (p1 - p0);
				dgBigVector e1 (p2 - p1);
				dgBigVector e2 (p0 - p2);

				hacd::HaF64 mag0 = e0 % e0;
				hacd::HaF64 mag1 = e1 % e1;
				hacd::HaF64 mag2 = e2 % e2;
				hacd::HaF64 maxMag = GetMax (mag0, mag1, mag2);
				hacd::HaF64 minMag = GetMin (mag0, mag1, mag2);
				hacd::HaF64 ratio = minMag / maxMag;

				if (ratio < aspect) {
					aspect = ratio;
				}
			}
		}
		aspect = sqrt (aspect);
		//aspect = 1.0f;
	}

	return aspect;
}